

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabItemBackground(ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImU32 col)

{
  ImVector<ImVec2> *this;
  ImGuiContext *pIVar1;
  ImU32 col_00;
  float fVar2;
  float fVar3;
  ImVec2 local_78;
  float local_6c;
  undefined1 local_68 [12];
  float fStack_5c;
  ImU32 local_4c;
  undefined1 local_48 [16];
  
  pIVar1 = GImGui;
  local_78.x = (bb->Min).x;
  fVar3 = (bb->Max).x - local_78.x;
  local_4c = col;
  if (fVar3 <= 0.0) {
    local_68._0_4_ = fVar3;
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x1cb8,"TabItemBackground","ImGui ASSERT FAILED: %s","width > 0.0f");
    local_78.x = (bb->Min).x;
    fVar3 = (float)local_68._0_4_;
  }
  fVar2 = (pIVar1->Style).TabRounding;
  fVar3 = fVar3 * 0.5 + -1.0;
  if (fVar3 <= fVar2) {
    fVar2 = fVar3;
  }
  local_48 = ZEXT416(~-(uint)(fVar2 <= 0.0) & (uint)fVar2);
  _local_68 = ZEXT416((uint)((bb->Min).y + 1.0));
  local_6c = (bb->Max).y + -1.0;
  local_78.y = local_6c;
  this = &draw_list->_Path;
  ImVector<ImVec2>::push_back(this,&local_78);
  local_68._0_4_ = (float)local_68._0_4_ + (float)local_48._0_4_;
  local_78.y = (float)local_68._0_4_;
  local_78.x = (bb->Min).x + (float)local_48._0_4_;
  ImDrawList::PathArcToFast(draw_list,&local_78,(float)local_48._0_4_,6,9);
  local_78.y = (float)local_68._0_4_;
  local_78.x = (bb->Max).x - (float)local_48._0_4_;
  ImDrawList::PathArcToFast(draw_list,&local_78,(float)local_48._0_4_,9,0xc);
  local_78.y = local_6c;
  local_78.x = (bb->Max).x;
  ImVector<ImVec2>::push_back(this,&local_78);
  ImDrawList::PathFillConvex(draw_list,local_4c);
  if (0.0 < (pIVar1->Style).TabBorderSize) {
    local_78.y = local_6c;
    local_78.x = (bb->Min).x + 0.5;
    ImVector<ImVec2>::push_back(this,&local_78);
    fVar3 = (bb->Min).x + (float)local_48._0_4_ + 0.5;
    fVar2 = (float)local_68._0_4_ + 0.5;
    fStack_5c = (float)local_68._4_4_ + 0.0;
    local_68._4_4_ = fVar2;
    local_68._0_4_ = fVar3;
    local_68._8_4_ = 0;
    local_78.y = fVar2;
    local_78.x = fVar3;
    ImDrawList::PathArcToFast(draw_list,&local_78,(float)local_48._0_4_,6,9);
    local_78.y = (float)local_68._4_4_;
    local_78.x = ((bb->Max).x - (float)local_48._0_4_) + -0.5;
    ImDrawList::PathArcToFast(draw_list,&local_78,(float)local_48._0_4_,9,0xc);
    local_78.y = local_6c;
    local_78.x = (bb->Max).x + -0.5;
    ImVector<ImVec2>::push_back(this,&local_78);
    col_00 = GetColorU32(5,1.0);
    ImDrawList::PathStroke(draw_list,col_00,false,(pIVar1->Style).TabBorderSize);
  }
  return;
}

Assistant:

void ImGui::TabItemBackground(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImU32 col)
{
    // While rendering tabs, we trim 1 pixel off the top of our bounding box so they can fit within a regular frame height while looking "detached" from it.
    ImGuiContext& g = *GImGui;
    const float width = bb.GetWidth();
    IM_UNUSED(flags);
    IM_ASSERT(width > 0.0f);
    const float rounding = ImMax(0.0f, ImMin(g.Style.TabRounding, width * 0.5f - 1.0f));
    const float y1 = bb.Min.y + 1.0f;
    const float y2 = bb.Max.y - 1.0f;
    draw_list->PathLineTo(ImVec2(bb.Min.x, y2));
    draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding, y1 + rounding), rounding, 6, 9);
    draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding, y1 + rounding), rounding, 9, 12);
    draw_list->PathLineTo(ImVec2(bb.Max.x, y2));
    draw_list->PathFillConvex(col);
    if (g.Style.TabBorderSize > 0.0f)
    {
        draw_list->PathLineTo(ImVec2(bb.Min.x + 0.5f, y2));
        draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding + 0.5f, y1 + rounding + 0.5f), rounding, 6, 9);
        draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding - 0.5f, y1 + rounding + 0.5f), rounding, 9, 12);
        draw_list->PathLineTo(ImVec2(bb.Max.x - 0.5f, y2));
        draw_list->PathStroke(GetColorU32(ImGuiCol_Border), false, g.Style.TabBorderSize);
    }
}